

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,int num_digits,string_view prefix,format_specs specs,bin_writer<3> f)

{
  ulong uVar1;
  ulong uVar2;
  format_specs local_68;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  local_58;
  
  local_58.prefix.size_ = prefix.size_;
  local_58.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_58.prefix.size_;
  local_68._9_1_ = specs._9_1_;
  local_68.fill.data_[0] = specs.fill.data_[0];
  local_58.size_ = uVar2;
  local_58.fill = local_68.fill.data_[0];
  if ((local_68._9_1_ & 0xf) == 4) {
    uVar1 = specs._0_8_ & 0xffffffff;
    local_58.padding = 0;
    if (uVar2 <= uVar1) {
      local_58.size_ = uVar1;
      local_58.padding = uVar1 - uVar2;
    }
  }
  else {
    local_68.precision = specs.precision;
    if (num_digits < local_68.precision) {
      local_58.size_ = (uint)local_68.precision + local_58.prefix.size_;
      local_58.padding = (ulong)(uint)(local_68.precision - num_digits);
      local_58.fill = '0';
    }
    else {
      local_58.padding = 0;
    }
  }
  local_68._8_8_ = specs._8_8_;
  if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
    local_68._8_8_ = specs._8_8_ | 0x200;
  }
  local_58.f.abs_value._0_8_ = (undefined8)f.abs_value;
  local_58.f.abs_value._8_8_ = f.abs_value._8_8_;
  local_58.f.num_digits = f.num_digits;
  local_58.f._20_4_ = f._20_4_;
  local_58.f._24_8_ = f._24_8_;
  local_68._0_8_ = specs._0_8_;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
            (this,&local_68,&local_58);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }